

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O1

bool __thiscall
SQVM::PLOCAL_INC(SQVM *this,SQInteger op,SQObjectPtr *target,SQObjectPtr *a,SQObjectPtr *incr)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectType SVar3;
  SQTable *pSVar4;
  bool bVar5;
  SQObjectPtr trg;
  SQObjectPtr local_28;
  
  local_28.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_28.super_SQObject._type = OT_NULL;
  bVar5 = ARITH_OP(this,op,&local_28,a,incr);
  if (bVar5) {
    SVar2 = (target->super_SQObject)._type;
    pSVar4 = (target->super_SQObject)._unVal.pTable;
    (target->super_SQObject)._unVal = (a->super_SQObject)._unVal;
    SVar3 = (a->super_SQObject)._type;
    (target->super_SQObject)._type = SVar3;
    if ((SVar3 >> 0x1b & 1) != 0) {
      pSVar1 = &(((target->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    if ((SVar2 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
    SVar2 = (a->super_SQObject)._type;
    pSVar4 = (a->super_SQObject)._unVal.pTable;
    (a->super_SQObject)._unVal.pTable = (SQTable *)local_28.super_SQObject._unVal;
    (a->super_SQObject)._type = local_28.super_SQObject._type;
    if ((local_28.super_SQObject._type >> 0x1b & 1) != 0) {
      pSVar1 = &(((a->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    if ((SVar2 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  return bVar5;
}

Assistant:

bool SQVM::PLOCAL_INC(SQInteger op,SQObjectPtr &target, SQObjectPtr &a, SQObjectPtr &incr)
{
    SQObjectPtr trg;
    _RET_ON_FAIL(ARITH_OP( op , trg, a, incr));
    target = a;
    a = trg;
    return true;
}